

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

void re_build_char(re_context *ctx,re_machine *machine,char ch)

{
  re_init_machine(ctx,machine);
  re_set_trans(ctx,machine->init,machine->final,ch);
  return;
}

Assistant:

static void re_build_char(re_context *ctx, re_machine *machine, char ch)
{
    /* initialize our new machine */
    re_init_machine(ctx, machine);

    /* allocate a transition tuple for the new state */
    re_set_trans(ctx, machine->init, machine->final, ch);
}